

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::
DoReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::NumericExprReader,ExprPrinter::NumericArgHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter> *this,int num_args,
          NumericArgHandler *arg_handler)

{
  bool bVar1;
  NumericExpr local_40;
  
  if (num_args < 1) {
    num_args = 0;
  }
  while (bVar1 = num_args != 0, num_args = num_args + -1, bVar1) {
    ReadNumericExpr_abi_cxx11_(&local_40,this,false);
    ExprPrinter::NumericArgHandler::AddArg(arg_handler,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void DoReadArgs(int num_args, ArgHandler &arg_handler) {
    ExprReader expr_reader;
    for (int i = 0; i < num_args; ++i)
      arg_handler.AddArg(expr_reader.Read(*this));
  }